

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

VertexData * __thiscall
Assimp::Ogre::Animation::AssociatedVertexData(Animation *this,VertexAnimationTrack *track)

{
  Mesh *this_00;
  SubMesh *pSVar1;
  VertexData **ppVVar2;
  
  this_00 = this->parentMesh;
  if (this_00 != (Mesh *)0x0) {
    if (track->target == 0) {
      ppVVar2 = &this_00->sharedVertexData;
    }
    else {
      pSVar1 = Ogre::Mesh::GetSubMesh(this_00,(ulong)(track->target - 1));
      ppVVar2 = &pSVar1->vertexData;
    }
    return *ppVVar2;
  }
  return (VertexData *)0x0;
}

Assistant:

VertexData *Animation::AssociatedVertexData(VertexAnimationTrack *track) const
{
    if (!parentMesh)
        return 0;

    bool sharedGeom = (track->target == 0);
    if (sharedGeom)
        return parentMesh->sharedVertexData;
    else
        return parentMesh->GetSubMesh(track->target-1)->vertexData;
}